

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float128_compare_arm(float128 a,float128 b,float_status *status)

{
  int iVar1;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  iVar1 = float128_compare_internal(a,b,0,status);
  return iVar1;
}

Assistant:

int float128_compare(float128 a, float128 b, float_status *status)
{
    return float128_compare_internal(a, b, 0, status);
}